

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O1

void __thiscall avro::json::JsonGenerator::encodeNumber<int>(JsonGenerator *this,int t)

{
  ostringstream oss;
  long *local_1b0;
  size_t local_1a8;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  sep(this);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,t);
  std::__cxx11::stringbuf::str();
  StreamWriter::writeBytes(&this->out_,(uint8_t *)local_1b0,local_1a8);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void encodeNumber(T t) {
        sep();
        std::ostringstream oss;
        oss << t;
        const std::string& s = oss.str();
        out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
        sep2();
    }